

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined1 local_50 [8];
  ImRect rect_for_touch;
  ImRect rect_clipped;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool clip_local;
  ImVec2 *r_max_local;
  ImVec2 *r_min_local;
  
  pIVar1 = GImGui;
  rect_clipped.Max = (ImVec2)GetCurrentWindowRead();
  ImRect::ImRect((ImRect *)&rect_for_touch.Max,r_min,r_max);
  if (clip) {
    ImRect::ClipWith((ImRect *)&rect_for_touch.Max,(ImRect *)((long)rect_clipped.Max + 0x1f0));
  }
  local_58 = ::operator-(&rect_for_touch.Max,&(pIVar1->Style).TouchExtraPadding);
  local_60 = operator+(&rect_clipped.Min,&(pIVar1->Style).TouchExtraPadding);
  ImRect::ImRect((ImRect *)local_50,&local_58,&local_60);
  bVar2 = ImRect::Contains((ImRect *)local_50,&(pIVar1->IO).MousePos);
  return bVar2;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(window->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    return rect_for_touch.Contains(g.IO.MousePos);
}